

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snapshot-file.c
# Opt level: O2

int faup_snapshot_file_zip(char *dirpath)

{
  int iVar1;
  mz_bool mVar2;
  DIR *__dirp;
  dirent *pdVar3;
  FILE *pFVar4;
  char *pcVar5;
  char *__ptr;
  size_t sVar6;
  int *piVar7;
  char *__format;
  char *full_file_path;
  char *zip_filename;
  stat_conflict zipstats;
  
  __dirp = opendir(dirpath);
  pFVar4 = _stderr;
  if (__dirp == (DIR *)0x0) {
    piVar7 = __errno_location();
    pcVar5 = strerror(*piVar7);
    fprintf(pFVar4,"Error reading directory \'%s\': %s\n",dirpath,pcVar5);
  }
  else {
    iVar1 = asprintf(&zip_filename,"%s.urls",dirpath);
    if (iVar1 < 0) {
      fwrite("Error: cannot concatenate snapshot urls with dirpath!\n",0x36,1,_stderr);
    }
    else {
      iVar1 = stat(zip_filename,(stat *)&zipstats);
      if (iVar1 == 0) {
        fprintf(_stderr,"The snapshot %s already exists!\n",zip_filename);
        free(zip_filename);
        closedir(__dirp);
      }
      else {
        while( true ) {
          while( true ) {
            do {
              pdVar3 = readdir(__dirp);
              if (pdVar3 == (dirent *)0x0) {
                free(zip_filename);
                closedir(__dirp);
                return 0;
              }
            } while (pdVar3->d_name[0] == '.');
            iVar1 = asprintf(&full_file_path,"%s%c%s",dirpath,0x2f);
            if (-1 < iVar1) break;
            fwrite("Error: cannot concatenate filename with dirpath!\n",0x31,1,_stderr);
          }
          pFVar4 = fopen(full_file_path,"rb");
          if (pFVar4 == (FILE *)0x0) break;
          fseek(pFVar4,0,2);
          pcVar5 = (char *)ftell(pFVar4);
          fseek(pFVar4,0,0);
          __ptr = (char *)malloc((size_t)(pcVar5 + 1));
          if (__ptr == (char *)0x0) {
            __format = "Cannot allocate the file size content:%lu";
LAB_001177ab:
            fprintf(_stderr,__format,pcVar5);
            free(full_file_path);
            fclose(pFVar4);
            full_file_path = __ptr;
            goto LAB_001177c7;
          }
          sVar6 = fread(__ptr,(size_t)pcVar5,1,pFVar4);
          if (sVar6 == 0) {
            __format = "Error reading file %s\n";
            pcVar5 = full_file_path;
            goto LAB_001177ab;
          }
          mVar2 = mz_zip_add_mem_to_archive_file_in_place
                            (zip_filename,full_file_path,__ptr,(size_t)pcVar5,(void *)0x0,0,9);
          if (mVar2 == 0) {
            __format = "Cannot create %s!\n";
            pcVar5 = full_file_path;
            goto LAB_001177ab;
          }
          fclose(pFVar4);
          free(__ptr);
          free(full_file_path);
        }
        fprintf(_stderr,"Cannot open file %s for reading!\n",full_file_path);
LAB_001177c7:
        free(full_file_path);
      }
    }
  }
  return -1;
}

Assistant:

int faup_snapshot_file_zip(char *dirpath)
{
  DIR *dir;
  struct dirent *ent;
  FILE *fp;

  char *zip_filename;
  long file_size;
  void *file_content;

  mz_bool status;
  mz_zip_archive zip_archive;

  struct stat zipstats;
  int retval;

  dir = opendir(dirpath);
  if (!dir) {
    fprintf(stderr, "Error reading directory '%s': %s\n", dirpath, strerror(errno));
    return -1;
  }

  retval = asprintf(&zip_filename, "%s.urls", dirpath);
  if (retval < 0) {
    fprintf(stderr, "Error: cannot concatenate snapshot urls with dirpath!\n");
    return -1;
  }
  
  retval = stat(zip_filename, &zipstats);
  if (retval == 0) {
    fprintf(stderr, "The snapshot %s already exists!\n", zip_filename);
    free(zip_filename);
    closedir(dir);
    return -1;
  }

  while ((ent = readdir(dir)) != NULL) {
      char *full_file_path;
      int retval;
      size_t readval;

      if (ent->d_name[0] == '.') { continue; }

      retval = asprintf(&full_file_path, "%s%c%s", dirpath, FAUP_OS_DIRSEP_C, ent->d_name);
      if (retval < 0) {
	fprintf(stderr, "Error: cannot concatenate filename with dirpath!\n");
	continue;
      }
      
      fp = fopen(full_file_path, "rb");
      if (!fp) {
	fprintf(stderr, "Cannot open file %s for reading!\n", full_file_path);
	free(full_file_path);
	return -1;
      }
      fseek(fp, 0, SEEK_END);
      file_size = ftell(fp);
      fseek(fp, 0, SEEK_SET);
      
      file_content = malloc(file_size + 1);
      if (!file_content) {
	fprintf(stderr, "Cannot allocate the file size content:%lu", file_size);
	free(full_file_path);
	goto err;
      }

      readval = fread(file_content, file_size, 1, fp);
      if (readval == 0) {
	fprintf(stderr, "Error reading file %s\n", full_file_path);
	free(full_file_path);
	goto err;
      }
      status = mz_zip_add_mem_to_archive_file_in_place(zip_filename, full_file_path, file_content, file_size, NULL, 0, MZ_BEST_COMPRESSION);
      if (!status) {
      	fprintf(stderr, "Cannot create %s!\n", full_file_path);
	free(full_file_path);
	goto err;
      }

      /* printf("file name:%s\n", full_file_path); */
      
      fclose(fp);
      free(file_content);
      free(full_file_path);
  }

  free(zip_filename);

  closedir(dir);
  
  return 0;

 err:
  fclose(fp);
  free(file_content);
  return -1;
}